

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O2

void __thiscall
kj::CidrRange::CidrRange
          (CidrRange *this,int family,ArrayPtr<const_unsigned_char> bits,uint bitCount)

{
  ulong __n;
  uint bitCount_local;
  Fault f;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  
  this->family = family;
  this->bitCount = bitCount;
  _kjCondition.left = &bitCount_local;
  bitCount_local = bitCount;
  if (family == 2) {
    _kjCondition.right = 0x20;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = bitCount < 0x21;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x4a,FAILED,"bitCount <= 32","_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else {
    _kjCondition.right = 0x80;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = bitCount < 0x81;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x4c,FAILED,"bitCount <= 128","_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  _kjCondition.left = (uint *)(bits.size_ << 3);
  _kjCondition._8_8_ = &bitCount_local;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = (uint *)(ulong)bitCount <= _kjCondition.left;
  if (_kjCondition.result) {
    __n = (ulong)(bitCount + 7 >> 3);
    memcpy(this->bits,bits.ptr,__n);
    memset(this->bits + __n,0,0x10 - __n);
    zeroIrrelevantBits(this);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
             ,0x4e,FAILED,"bits.size() * 8 >= bitCount","_kjCondition,",
             (DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

CidrRange::CidrRange(int family, ArrayPtr<const byte> bits, uint bitCount)
    : family(family), bitCount(bitCount) {
  if (family == AF_INET) {
    KJ_REQUIRE(bitCount <= 32);
  } else {
    KJ_REQUIRE(bitCount <= 128);
  }
  KJ_REQUIRE(bits.size() * 8 >= bitCount);
  size_t byteCount = (bitCount + 7) / 8;
  memcpy(this->bits, bits.begin(), byteCount);
  memset(this->bits + byteCount, 0, sizeof(this->bits) - byteCount);

  zeroIrrelevantBits();
}